

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O2

void __thiscall
FluidSynthMIDIDevice::FluidSettingInt(FluidSynthMIDIDevice *this,char *setting,int value)

{
  int iVar1;
  _func_int_fluid_settings_t_ptr_char_ptr_int *p_Var2;
  _func_int_fluid_synth_t_ptr_int_int *p_Var3;
  _func_int_fluid_synth_t_ptr_int *p_Var4;
  _func_void_fluid_synth_t_ptr_double_double_double_double *UNRECOVERED_JUMPTABLE;
  _func_void_fluid_synth_t_ptr_int_double_double_double_int *UNRECOVERED_JUMPTABLE_00;
  _func_void_fluid_synth_t_ptr_int *UNRECOVERED_JUMPTABLE_01;
  TReqProc<FluidSynthModule,_void_(*)(fluid_synth_t_*,_int)> *this_00;
  char *format;
  
  if ((this->FluidSynth != (fluid_synth_t *)0x0) && (this->FluidSettings != (fluid_settings_t *)0x0)
     ) {
    iVar1 = strcmp(setting,"synth.interpolation");
    if (iVar1 == 0) {
      p_Var3 = TReqProc::operator_cast_to_function_pointer
                         ((TReqProc *)&fluid_synth_set_interp_method);
      iVar1 = (*p_Var3)(this->FluidSynth,-1,value);
      if (iVar1 != 0) {
        format = "Setting interpolation method %d failed.\n";
        goto LAB_0035de79;
      }
    }
    else {
      iVar1 = strcmp(setting,"synth.polyphony");
      if (iVar1 != 0) {
        iVar1 = strcmp(setting,"z.reverb-changed");
        if (iVar1 == 0) {
          UNRECOVERED_JUMPTABLE =
               TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_reverb);
          (*UNRECOVERED_JUMPTABLE)
                    (this->FluidSynth,(double)fluid_reverb_roomsize.Value,
                     (double)fluid_reverb_damping.Value,(double)fluid_reverb_width.Value,
                     (double)fluid_reverb_level.Value);
          return;
        }
        iVar1 = strcmp(setting,"z.chorus-changed");
        if (iVar1 != 0) {
          p_Var2 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_settings_setint);
          iVar1 = (*p_Var2)(this->FluidSettings,setting,value);
          if (iVar1 == 0) {
            Printf("Failed to set %s to %d.\n",setting,(ulong)(uint)value);
            return;
          }
          iVar1 = strcmp(setting,"synth.reverb.active");
          if (iVar1 == 0) {
            this_00 = &fluid_synth_set_reverb_on;
          }
          else {
            iVar1 = strcmp(setting,"synth.chorus.active");
            if (iVar1 != 0) {
              return;
            }
            this_00 = &fluid_synth_set_chorus_on;
          }
          UNRECOVERED_JUMPTABLE_01 =
               TReqProc::operator_cast_to_function_pointer((TReqProc *)this_00);
          (*UNRECOVERED_JUMPTABLE_01)(this->FluidSynth,value);
          return;
        }
        UNRECOVERED_JUMPTABLE_00 =
             TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_chorus);
        (*UNRECOVERED_JUMPTABLE_00)
                  (this->FluidSynth,fluid_chorus_voices.Value,(double)fluid_chorus_level.Value,
                   (double)fluid_chorus_speed.Value,(double)fluid_chorus_depth.Value,
                   fluid_chorus_type.Value);
        return;
      }
      p_Var4 = TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_set_polyphony);
      iVar1 = (*p_Var4)(this->FluidSynth,value);
      if (iVar1 != 0) {
        format = "Setting polyphony to %d failed.\n";
LAB_0035de79:
        Printf(format,(ulong)(uint)value);
        return;
      }
    }
  }
  return;
}

Assistant:

void FluidSynthMIDIDevice::FluidSettingInt(const char *setting, int value)
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return;
	}

	if (strcmp(setting, "synth.interpolation") == 0)
	{
		if (FLUID_OK != fluid_synth_set_interp_method(FluidSynth, -1, value))
		{
			Printf("Setting interpolation method %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "synth.polyphony") == 0)
	{
		if (FLUID_OK != fluid_synth_set_polyphony(FluidSynth, value))
		{
			Printf("Setting polyphony to %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "z.reverb-changed") == 0)
	{
		fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
			fluid_reverb_width, fluid_reverb_level);
	}
	else if (strcmp(setting, "z.chorus-changed") == 0)
	{
		fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
			fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);
	}
	else if (0 == fluid_settings_setint(FluidSettings, setting, value))
	{
		Printf("Failed to set %s to %d.\n", setting, value);
	}
	// fluid_settings_setint succeeded; update these settings in the running synth, too
	else if (strcmp(setting, "synth.reverb.active") == 0)
	{
		fluid_synth_set_reverb_on(FluidSynth, value);
	}
	else if (strcmp(setting, "synth.chorus.active") == 0)
	{
		fluid_synth_set_chorus_on(FluidSynth, value);
	}
}